

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addition.h
# Opt level: O3

void __thiscall Addition_PlusPlus_Test::TestBody(Addition_PlusPlus_Test *this)

{
  pointer *ppcVar1;
  bool bVar2;
  BigNumber *pBVar3;
  char *pcVar4;
  undefined1 local_a0 [8];
  BigNumber num_1;
  AssertionResult gtest_ar_1;
  BigNumber local_58;
  AssertHelper local_30;
  AssertionResult gtest_ar;
  
  ppcVar1 = &local_58.m_digits.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_58._vptr_BigNumber = (_func_int **)ppcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1234","");
  BigNumber::BigNumber((BigNumber *)local_a0,(string *)&local_58);
  if (local_58._vptr_BigNumber != (_func_int **)ppcVar1) {
    operator_delete(local_58._vptr_BigNumber);
  }
  BigNumber::operator++(&local_58,(BigNumber *)local_a0,0);
  BigNumber::toString_abi_cxx11_((string *)&num_1.m_symbol,&local_58);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_30,"\"1234\"","num_1++.toString()",(char (*) [5])"1234",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&num_1.m_symbol);
  if ((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)CONCAT71(num_1._33_7_,(undefined1)num_1.m_symbol) != &gtest_ar_1.message_) {
    operator_delete((undefined1 *)CONCAT71(num_1._33_7_,(undefined1)num_1.m_symbol));
  }
  BigNumber::~BigNumber(&local_58);
  if (local_30.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&num_1.m_symbol,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/addition.h"
               ,0x18,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&num_1.m_symbol,(Message *)&local_58)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&num_1.m_symbol);
    if (local_58._vptr_BigNumber != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_58._vptr_BigNumber != (_func_int **)0x0)) {
        (**(code **)(*local_58._vptr_BigNumber + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  BigNumber::toString_abi_cxx11_((string *)&local_58,(BigNumber *)local_a0);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&num_1.m_symbol,"\"1235\"","num_1.toString()",(char (*) [5])"1235",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58);
  if (local_58._vptr_BigNumber != (_func_int **)ppcVar1) {
    operator_delete(local_58._vptr_BigNumber);
  }
  if ((undefined1)num_1.m_symbol == ZERO) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar_1._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_1._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/addition.h"
               ,0x19,pcVar4);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_58._vptr_BigNumber != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_58._vptr_BigNumber != (_func_int **)0x0)) {
        (**(code **)(*local_58._vptr_BigNumber + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  BigNumber::operator++(&local_58,(BigNumber *)local_a0,0);
  BigNumber::toString_abi_cxx11_((string *)&num_1.m_symbol,&local_58);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_30,"\"1235\"","num_1++.toString()",(char (*) [5])"1235",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&num_1.m_symbol);
  if ((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)CONCAT71(num_1._33_7_,(undefined1)num_1.m_symbol) != &gtest_ar_1.message_) {
    operator_delete((undefined1 *)CONCAT71(num_1._33_7_,(undefined1)num_1.m_symbol));
  }
  BigNumber::~BigNumber(&local_58);
  if (local_30.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&num_1.m_symbol,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/addition.h"
               ,0x1a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&num_1.m_symbol,(Message *)&local_58)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&num_1.m_symbol);
    if (local_58._vptr_BigNumber != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_58._vptr_BigNumber != (_func_int **)0x0)) {
        (**(code **)(*local_58._vptr_BigNumber + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pBVar3 = BigNumber::operator++((BigNumber *)local_a0);
  BigNumber::toString_abi_cxx11_((string *)&local_58,pBVar3);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&num_1.m_symbol,"\"1237\"","(++num_1).toString()",(char (*) [5])"1237",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58);
  if (local_58._vptr_BigNumber != (_func_int **)ppcVar1) {
    operator_delete(local_58._vptr_BigNumber);
  }
  if ((undefined1)num_1.m_symbol == ZERO) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar_1._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_1._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/addition.h"
               ,0x1b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_58._vptr_BigNumber != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_58._vptr_BigNumber != (_func_int **)0x0)) {
        (**(code **)(*local_58._vptr_BigNumber + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pBVar3 = BigNumber::operator++((BigNumber *)local_a0);
  BigNumber::toString_abi_cxx11_((string *)&local_58,pBVar3);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&num_1.m_symbol,"\"1238\"","(++num_1).toString()",(char (*) [5])0x375709,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58);
  if (local_58._vptr_BigNumber != (_func_int **)ppcVar1) {
    operator_delete(local_58._vptr_BigNumber);
  }
  if ((undefined1)num_1.m_symbol == ZERO) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar_1._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_1._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/addition.h"
               ,0x1c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_58._vptr_BigNumber != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_58._vptr_BigNumber != (_func_int **)0x0)) {
        (**(code **)(*local_58._vptr_BigNumber + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  BigNumber::toString_abi_cxx11_((string *)&local_58,(BigNumber *)local_a0);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&num_1.m_symbol,"\"1238\"","num_1.toString()",(char (*) [5])0x375709,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58);
  if (local_58._vptr_BigNumber != (_func_int **)ppcVar1) {
    operator_delete(local_58._vptr_BigNumber);
  }
  if ((undefined1)num_1.m_symbol == ZERO) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar_1._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_1._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/addition.h"
               ,0x1d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_58._vptr_BigNumber != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_58._vptr_BigNumber != (_func_int **)0x0)) {
        (**(code **)(*local_58._vptr_BigNumber + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  BigNumber::~BigNumber((BigNumber *)local_a0);
  return;
}

Assistant:

TEST(Addition, PlusPlus)
{
    BigNumber num_1("1234");
    EXPECT_EQ("1234", num_1++.toString());
    EXPECT_EQ("1235", num_1.toString());
    EXPECT_EQ("1235", num_1++.toString());
    EXPECT_EQ("1237", (++num_1).toString());
    EXPECT_EQ("1238", (++num_1).toString());
    EXPECT_EQ("1238", num_1.toString());
}